

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O0

Process * asl::Process::execute
                    (Process *__return_storage_ptr__,String *command,Array<asl::String> *args)

{
  bool bVar1;
  int iVar2;
  Process *pPVar3;
  char local_1f88 [8];
  char buffer [8000];
  int i;
  int n;
  Array<asl::String> *args_local;
  String *command_local;
  Process *p;
  
  Process(__return_storage_ptr__);
  run(__return_storage_ptr__,command,args);
  while (pPVar3 = __return_storage_ptr__, bVar1 = running(__return_storage_ptr__), bVar1) {
    sleep((uint)pPVar3);
    iVar2 = outputAvailable(__return_storage_ptr__);
    if (0 < iVar2) {
      iVar2 = readOutput(__return_storage_ptr__,local_1f88,8000);
      asl::String::append(&__return_storage_ptr__->_output,local_1f88,iVar2);
    }
    iVar2 = errorsAvailable(__return_storage_ptr__);
    if (0 < iVar2) {
      iVar2 = readErrors(__return_storage_ptr__,local_1f88,8000);
      asl::String::append(&__return_storage_ptr__->_errors,local_1f88,iVar2);
    }
  }
  while (iVar2 = readOutput(__return_storage_ptr__,local_1f88,8000), 0 < iVar2) {
    asl::String::append(&__return_storage_ptr__->_output,local_1f88,iVar2);
  }
  while (iVar2 = readErrors(__return_storage_ptr__,local_1f88,8000), 0 < iVar2) {
    asl::String::append(&__return_storage_ptr__->_errors,local_1f88,iVar2);
  }
  iVar2 = exitStatus(__return_storage_ptr__);
  __return_storage_ptr__->_exitstat = iVar2;
  return __return_storage_ptr__;
}

Assistant:

Process Process::execute(const String& command, const Array<String>& args)
{
	Process p;
	p.run(command, args);
	int n, i = 0;
	char buffer[8000];
	while (p.running())
	{
		sleep((i++)%16 == 0 ? 0.001 : 0);
		if (p.outputAvailable() > 0)
		{
			n = p.readOutput(buffer, sizeof(buffer));
			p._output.append(buffer, n);
		}
		if (p.errorsAvailable() > 0)
		{
			n = p.readErrors(buffer, sizeof(buffer));
			p._errors.append(buffer, n);
		}
	}
	while (n = p.readOutput(buffer, sizeof(buffer)), n > 0)
		p._output.append(buffer, n);
	while (n = p.readErrors(buffer, sizeof(buffer)), n > 0)
		p._errors.append(buffer, n);
	p._exitstat = p.exitStatus();
	return p;
}